

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int resolve_scope_var(JSContext *ctx,JSFunctionDef *s,JSAtom var_name,int scope_level,int op,
                     DynBuf *bc,uint8_t *bc_buf,LabelSlot *ls,int pos_next)

{
  BOOL BVar1;
  int iVar2;
  int *piVar3;
  byte *pbVar4;
  long lVar5;
  int in_ECX;
  JSFunctionDef *s_00;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  bool bVar6;
  uint8_t *in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int get_op_1;
  int is_with;
  JSClosureVar *cv;
  int idx1;
  int get_op;
  BOOL is_arg_scope;
  BOOL is_pseudo_var;
  JSVarDef *vd;
  JSFunctionDef *fd;
  int label_done;
  int is_put;
  int var_idx;
  int idx;
  undefined4 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  uint8_t in_stack_fffffffffffffebf;
  uint in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint in_stack_fffffffffffffec8;
  JSAtom in_stack_fffffffffffffecc;
  uint in_stack_fffffffffffffed0;
  JSAtom in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  JSAtom in_stack_fffffffffffffedc;
  JSContext *in_stack_fffffffffffffee0;
  BOOL is_arg;
  JSFunctionDef *in_stack_fffffffffffffee8;
  JSFunctionDef *in_stack_fffffffffffffef0;
  int var_idx_00;
  JSFunctionDef *in_stack_fffffffffffffef8;
  JSContext *in_stack_ffffffffffffff00;
  BOOL in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  JSVarKindEnum var_kind;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int local_60;
  long local_48;
  uint local_38;
  uint local_34;
  
  bVar6 = true;
  if (((in_EDX != 0x73) && (bVar6 = true, in_EDX != 0x72)) && (bVar6 = true, in_EDX != 0x71)) {
    bVar6 = in_EDX == 8;
  }
  local_38 = 0xffffffff;
  local_34 = *(uint *)(*(long *)(in_RSI + 0xf0) + 4 + (long)in_ECX * 8);
  while (-1 < (int)local_34) {
    piVar3 = (int *)(*(long *)(in_RSI + 0x90) + (long)(int)local_34 * 0x10);
    if (*piVar3 == in_EDX) {
      if (((in_R8D == 0xb7) || (in_R8D == 0xb9)) && ((piVar3[3] & 1U) != 0)) {
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
        dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT13(in_stack_fffffffffffffebf,
                              CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        return in_stack_00000018;
      }
      local_38 = local_34;
      break;
    }
    if ((*piVar3 == 0x54) && (!bVar6)) {
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
      in_stack_fffffffffffffeb8 = 1;
      var_object_test(in_stack_fffffffffffffee0,
                      (JSFunctionDef *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                      ,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                      (DynBuf *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                      (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (BOOL)in_stack_fffffffffffffef0);
    }
    local_34 = piVar3[2];
  }
  if ((int)local_38 < 0) {
    if (local_34 != 0xfffffffe) {
      local_38 = find_var((JSContext *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                          ,(JSFunctionDef *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          CONCAT13(in_stack_fffffffffffffebf,
                                   CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    }
    if (((int)local_38 < 0) && (bVar6)) {
      local_38 = resolve_pseudo_var((JSContext *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                    (JSFunctionDef *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    CONCAT13(in_stack_fffffffffffffebf,
                                             CONCAT12(in_stack_fffffffffffffebe,
                                                      in_stack_fffffffffffffebc)));
    }
    if ((((int)local_38 < 0) && (in_EDX == 0x4d)) && (*(int *)(in_RSI + 0x60) != 0)) {
      local_38 = add_arguments_var((JSContext *)
                                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                   (JSFunctionDef *)
                                   CONCAT17(in_stack_fffffffffffffebf,
                                            CONCAT16(in_stack_fffffffffffffebe,
                                                     CONCAT24(in_stack_fffffffffffffebc,
                                                              in_stack_fffffffffffffeb8))));
    }
    if ((((int)local_38 < 0) && (*(int *)(in_RSI + 0x44) != 0)) &&
       (in_EDX == *(int *)(in_RSI + 0x88))) {
      local_38 = add_func_var((JSContext *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (JSFunctionDef *)
                              CONCAT17(in_stack_fffffffffffffebf,
                                       CONCAT16(in_stack_fffffffffffffebe,
                                                CONCAT24(in_stack_fffffffffffffebc,
                                                         in_stack_fffffffffffffeb8))),0);
    }
  }
  if ((int)local_38 < 0) {
    if (((local_34 != 0xfffffffe) && (-1 < *(int *)(in_RSI + 0xb4))) && (!bVar6)) {
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
      in_stack_fffffffffffffeb8 = 0;
      var_object_test(in_stack_fffffffffffffee0,
                      (JSFunctionDef *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                      ,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                      (DynBuf *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                      (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (BOOL)in_stack_fffffffffffffef0);
    }
    local_48 = in_RSI;
    if ((-1 < *(int *)(in_RSI + 0xb8)) && (!bVar6)) {
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
      in_stack_fffffffffffffeb8 = 0;
      var_object_test(in_stack_fffffffffffffee0,
                      (JSFunctionDef *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                      ,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                      (DynBuf *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                      (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (BOOL)in_stack_fffffffffffffef0);
    }
    do {
      if (*(long *)(local_48 + 8) == 0) break;
      piVar3 = (int *)(local_48 + 0x14);
      local_48 = *(long *)(local_48 + 8);
      local_34 = *(uint *)(*(long *)(local_48 + 0xf0) + 4 + (long)*piVar3 * 8);
      while (-1 < (int)local_34) {
        piVar3 = (int *)(*(long *)(local_48 + 0x90) + (long)(int)local_34 * 0x10);
        if (*piVar3 == in_EDX) {
          if (((in_R8D == 0xb7) || (in_R8D == 0xb9)) && ((piVar3[3] & 1U) != 0)) {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
            JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc);
            dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         CONCAT13(in_stack_fffffffffffffebf,
                                  CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
            return in_stack_00000018;
          }
          local_38 = local_34;
          break;
        }
        if ((*piVar3 == 0x54) && (!bVar6)) {
          piVar3[3] = piVar3[3] & 0xfffffffbU | 4;
          in_stack_fffffffffffffeb8 = 0;
          in_stack_fffffffffffffec0 = 0;
          in_stack_fffffffffffffec8 = 0;
          iVar2 = get_closure_var((JSContext *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                  in_stack_fffffffffffffee8,
                                  (BOOL)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                  (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                                  in_stack_ffffffffffffff10,(BOOL)in_stack_ffffffffffffff18,
                                  (JSVarKindEnum)in_stack_ffffffffffffff20);
          if (-1 < iVar2) {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
            dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
            in_stack_fffffffffffffeb8 = 1;
            var_object_test(in_stack_fffffffffffffee0,
                            (JSFunctionDef *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                            (DynBuf *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            (BOOL)in_stack_fffffffffffffef0);
          }
        }
        local_34 = piVar3[2];
      }
      if (((-1 < (int)local_38) ||
          ((local_34 != 0xfffffffe &&
           (local_38 = find_var((JSContext *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                (JSFunctionDef *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                CONCAT13(in_stack_fffffffffffffebf,
                                         CONCAT12(in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffebc))), -1 < (int)local_38))
          )) || ((bVar6 && (local_38 = resolve_pseudo_var((JSContext *)
                                                          CONCAT44(in_stack_fffffffffffffecc,
                                                                   in_stack_fffffffffffffec8),
                                                          (JSFunctionDef *)
                                                          CONCAT44(in_stack_fffffffffffffec4,
                                                                   in_stack_fffffffffffffec0),
                                                          CONCAT13(in_stack_fffffffffffffebf,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffebc))), -1 < (int)local_38))
                )) break;
      if ((in_EDX == 0x4d) && (*(int *)(local_48 + 0x60) != 0)) {
        local_38 = add_arguments_var((JSContext *)
                                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                     (JSFunctionDef *)
                                     CONCAT17(in_stack_fffffffffffffebf,
                                              CONCAT16(in_stack_fffffffffffffebe,
                                                       CONCAT24(in_stack_fffffffffffffebc,
                                                                in_stack_fffffffffffffeb8))));
        break;
      }
      if ((*(int *)(local_48 + 0x44) != 0) && (*(int *)(local_48 + 0x88) == in_EDX)) {
        local_38 = add_func_var((JSContext *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (JSFunctionDef *)
                                CONCAT17(in_stack_fffffffffffffebf,
                                         CONCAT16(in_stack_fffffffffffffebe,
                                                  CONCAT24(in_stack_fffffffffffffebc,
                                                           in_stack_fffffffffffffeb8))),0);
        break;
      }
      if (((local_34 != 0xfffffffe) && (-1 < *(int *)(local_48 + 0xb4))) && (!bVar6)) {
        lVar5 = *(long *)(local_48 + 0x90) + (long)*(int *)(local_48 + 0xb4) * 0x10;
        *(uint *)(lVar5 + 0xc) = *(uint *)(lVar5 + 0xc) & 0xfffffffb | 4;
        in_stack_fffffffffffffec0 = 0;
        in_stack_fffffffffffffec8 = 0;
        get_closure_var((JSContext *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee8,(BOOL)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                        (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                        in_stack_ffffffffffffff10,(BOOL)in_stack_ffffffffffffff18,
                        (JSVarKindEnum)in_stack_ffffffffffffff20);
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
        in_stack_fffffffffffffeb8 = 0;
        var_object_test(in_stack_fffffffffffffee0,
                        (JSFunctionDef *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                        (DynBuf *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (BOOL)in_stack_fffffffffffffef0);
      }
      if ((-1 < *(int *)(local_48 + 0xb8)) && (!bVar6)) {
        lVar5 = *(long *)(local_48 + 0x90) + (long)*(int *)(local_48 + 0xb8) * 0x10;
        *(uint *)(lVar5 + 0xc) = *(uint *)(lVar5 + 0xc) & 0xfffffffb | 4;
        in_stack_fffffffffffffec0 = 0;
        in_stack_fffffffffffffec8 = 0;
        get_closure_var((JSContext *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee8,(BOOL)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                        (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                        in_stack_ffffffffffffff10,(BOOL)in_stack_ffffffffffffff18,
                        (JSVarKindEnum)in_stack_ffffffffffffff20);
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
        in_stack_fffffffffffffeb8 = 0;
        var_object_test(in_stack_fffffffffffffee0,
                        (JSFunctionDef *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                        (DynBuf *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (BOOL)in_stack_fffffffffffffef0);
      }
    } while (*(int *)(local_48 + 0x38) == 0);
    var_kind = (JSVarKindEnum)in_stack_ffffffffffffff20;
    BVar1 = (BOOL)in_stack_ffffffffffffff18;
    if (local_48 == 0) {
      local_48 = in_RSI;
    }
    if (((int)local_38 < 0) && (*(int *)(local_48 + 0x38) != 0)) {
      local_60 = 0;
      while( true ) {
        var_kind = (JSVarKindEnum)in_stack_ffffffffffffff20;
        BVar1 = (BOOL)in_stack_ffffffffffffff18;
        if (*(int *)(local_48 + 0x198) <= local_60) break;
        pbVar4 = (byte *)(*(long *)(local_48 + 0x1a0) + (long)local_60 * 8);
        iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        BVar1 = (BOOL)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        if (in_EDX == *(int *)(pbVar4 + 4)) {
          if (local_48 == in_RSI) {
            local_34 = local_60;
          }
          else {
            in_stack_fffffffffffffec0 = (uint)(*pbVar4 >> 2 & 1);
            in_stack_fffffffffffffec8 = (uint)(*pbVar4 >> 3 & 1);
            in_stack_fffffffffffffed0 = (uint)(*pbVar4 >> 4);
            local_34 = get_closure_var2(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                        in_stack_fffffffffffffef0,BVar1,
                                        (BOOL)in_stack_fffffffffffffee8,iVar2,var_kind,
                                        (BOOL)in_stack_ffffffffffffff28,
                                        (BOOL)in_stack_ffffffffffffff30,
                                        (JSVarKindEnum)in_stack_ffffffffffffff38);
          }
          goto LAB_001a4e32;
        }
        if ((((*(int *)(pbVar4 + 4) == 0x52) || (*(int *)(pbVar4 + 4) == 0x53)) ||
            (*(int *)(pbVar4 + 4) == 0x54)) && (!bVar6)) {
          if (local_48 != in_RSI) {
            in_stack_fffffffffffffec0 = 0;
            in_stack_fffffffffffffec8 = 0;
            in_stack_fffffffffffffed0 = 0;
            get_closure_var2(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                             in_stack_fffffffffffffef0,BVar1,(BOOL)in_stack_fffffffffffffee8,iVar2,
                             var_kind,(BOOL)in_stack_ffffffffffffff28,
                             (BOOL)in_stack_ffffffffffffff30,
                             (JSVarKindEnum)in_stack_ffffffffffffff38);
          }
          dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebf);
          dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
          var_object_test(in_stack_fffffffffffffee0,
                          (JSFunctionDef *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                          (DynBuf *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          (BOOL)in_stack_fffffffffffffef0);
        }
        local_60 = local_60 + 1;
      }
    }
    if (-1 < (int)local_38) {
      is_arg = (BOOL)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      if ((local_38 & 0x20000000) == 0) {
        lVar5 = *(long *)(local_48 + 0x90) + (long)(int)local_38 * 0x10;
        *(uint *)(lVar5 + 0xc) = *(uint *)(lVar5 + 0xc) & 0xfffffffb | 4;
        in_stack_fffffffffffffec0 =
             *(uint *)(*(long *)(local_48 + 0x90) + (long)(int)local_38 * 0x10 + 0xc) >> 1 & 1;
        in_stack_fffffffffffffec8 =
             *(uint *)(*(long *)(local_48 + 0x90) + (long)(int)local_38 * 0x10 + 0xc) >> 3 & 0xf;
        local_34 = get_closure_var((JSContext *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                   in_stack_fffffffffffffee8,is_arg,(int)in_stack_fffffffffffffee0,
                                   in_stack_fffffffffffffedc,in_stack_ffffffffffffff10,BVar1,
                                   var_kind);
      }
      else {
        lVar5 = *(long *)(local_48 + 0xa0) + (long)(int)(local_38 + 0xe0000000) * 0x10;
        *(uint *)(lVar5 + 0xc) = *(uint *)(lVar5 + 0xc) & 0xfffffffb | 4;
        in_stack_fffffffffffffec0 = 0;
        in_stack_fffffffffffffec8 = 0;
        local_34 = get_closure_var((JSContext *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                   in_stack_fffffffffffffee8,is_arg,(int)in_stack_fffffffffffffee0,
                                   in_stack_fffffffffffffedc,in_stack_ffffffffffffff10,BVar1,
                                   var_kind);
      }
      if (-1 < (int)local_34) {
LAB_001a4e32:
        var_idx_00 = (int)in_stack_fffffffffffffef8;
        iVar2 = (int)in_stack_fffffffffffffef0;
        if (((in_R8D == 0xb7) || (in_R8D == 0xb9)) &&
           ((*(byte *)(*(long *)(in_RSI + 0x1a0) + (long)(int)local_34 * 8) >> 2 & 1) != 0)) {
          dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebf);
          JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc);
          dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       CONCAT13(in_stack_fffffffffffffebf,
                                CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
          dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebf);
          return in_stack_00000018;
        }
        switch(in_R8D) {
        case 0xb8:
          dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebf);
          return in_stack_00000018;
        case 0xb9:
          goto switchD_001a4eff_caseD_b9;
        case 0xba:
          dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebf);
        case 0xb5:
        case 0xb6:
        case 0xb7:
        case 0xbb:
          if (in_R8D == 0xb7 || in_R8D == 0xbb) {
            if ((*(byte *)(*(long *)(in_RSI + 0x1a0) + (long)(int)local_34 * 8) >> 3 & 1) == 0) {
              dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebf);
            }
            else if (in_R8D == 0xbb) {
              if (in_EDX == 8) {
                dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebf);
              }
              else {
                dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebf);
              }
            }
            else {
              dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebf);
            }
          }
          else if ((*(byte *)(*(long *)(in_RSI + 0x1a0) + (long)(int)local_34 * 8) >> 3 & 1) == 0) {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
          }
          else {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
          }
          dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
          return in_stack_00000018;
        default:
          return in_stack_00000018;
        }
      }
    }
    iVar2 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    s_00 = (JSFunctionDef *)(ulong)(in_R8D - 0xb5);
    switch(s_00) {
    case (JSFunctionDef *)0x0:
    case (JSFunctionDef *)0x1:
    case (JSFunctionDef *)0x2:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
      dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT13(in_stack_fffffffffffffebf,
                            CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
      break;
    case (JSFunctionDef *)0x3:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
      dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT13(in_stack_fffffffffffffebf,
                            CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
      break;
    case (JSFunctionDef *)0x4:
      BVar1 = can_opt_put_global_ref_value(in_stack_00000008,*(int *)(in_stack_00000010 + 4));
      if (BVar1 == 0) {
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
        dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT13(in_stack_fffffffffffffebf,
                              CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
      }
      else {
        in_stack_00000018 =
             optimize_scope_make_global_ref
                       ((JSContext *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        s_00,(DynBuf *)in_stack_ffffffffffffff00,
                        (uint8_t *)in_stack_fffffffffffffef8,(LabelSlot *)in_stack_fffffffffffffef0,
                        iVar2,var_kind);
      }
      break;
    case (JSFunctionDef *)0x5:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
      dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT13(in_stack_fffffffffffffebf,
                            CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
      break;
    case (JSFunctionDef *)0x6:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
      dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT13(in_stack_fffffffffffffebf,
                            CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    }
  }
  else if (((in_R8D == 0xb7) || (in_R8D == 0xb9)) &&
          (((local_38 & 0x20000000) == 0 &&
           ((*(uint *)(*(long *)(in_RSI + 0x90) + (long)(int)local_38 * 0x10 + 0xc) & 1) != 0)))) {
    dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffebf);
    JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 CONCAT13(in_stack_fffffffffffffebf,
                          CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffebf);
  }
  else {
    switch(in_R8D) {
    case 0xb8:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
      break;
    case 0xb9:
      if (((local_38 & 0x20000000) == 0) &&
         ((*(uint *)(*(long *)(in_RSI + 0x90) + (long)(int)local_38 * 0x10 + 0xc) >> 3 & 0xf) == 4))
      {
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
        dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT13(in_stack_fffffffffffffebf,
                              CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
        dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT13(in_stack_fffffffffffffebf,
                              CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
      }
      else {
        BVar1 = can_opt_put_ref_value(in_stack_00000008,*(int *)(in_stack_00000010 + 4));
        if (BVar1 == 0) {
          if ((local_38 & 0x20000000) == 0) {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
            JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc);
            dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         CONCAT13(in_stack_fffffffffffffebf,
                                  CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
            dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
          }
          else {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
            JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc);
            dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         CONCAT13(in_stack_fffffffffffffebf,
                                  CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
            dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
          }
        }
        else {
          if ((local_38 & 0x20000000) != 0) {
            local_38 = local_38 + 0xe0000000;
          }
          in_stack_00000018 =
               optimize_scope_make_ref
                         (in_stack_fffffffffffffee0,
                          (JSFunctionDef *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (DynBuf *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (uint8_t *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (LabelSlot *)CONCAT44(in_stack_fffffffffffffec4,local_38),
                          CONCAT13(in_stack_fffffffffffffebf,
                                   CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),
                          (int)in_stack_fffffffffffffef0,(int)in_stack_fffffffffffffef8);
        }
      }
      break;
    case 0xba:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebf);
    case 0xb5:
    case 0xb6:
    case 0xb7:
    case 0xbb:
      if ((local_38 & 0x20000000) == 0) {
        if (in_R8D == 0xb7 || in_R8D == 0xbb) {
          if ((*(uint *)(*(long *)(in_RSI + 0x90) + (long)(int)local_38 * 0x10 + 0xc) >> 1 & 1) == 0
             ) {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
          }
          else if (in_R8D == 0xbb) {
            if (in_EDX == 8) {
              dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebf);
            }
            else {
              dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebf);
            }
          }
          else {
            dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebf);
          }
        }
        else if ((*(uint *)(*(long *)(in_RSI + 0x90) + (long)(int)local_38 * 0x10 + 0xc) >> 1 & 1)
                 == 0) {
          dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebf);
        }
        else {
          dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebf);
        }
        dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
      }
      else {
        dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebf);
        dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
      }
    }
  }
  return in_stack_00000018;
switchD_001a4eff_caseD_b9:
  if (*(byte *)(*(long *)(in_RSI + 0x1a0) + (long)(int)local_34 * 8) >> 4 == 4) {
    dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffebf);
    dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffebf);
    dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
    dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffebf);
    JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 CONCAT13(in_stack_fffffffffffffebf,
                          CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffebf);
    JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 CONCAT13(in_stack_fffffffffffffebf,
                          CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    return in_stack_00000018;
  }
  BVar1 = can_opt_put_ref_value(in_stack_00000008,*(int *)(in_stack_00000010 + 4));
  if (BVar1 != 0) {
    iVar2 = optimize_scope_make_ref
                      (in_stack_fffffffffffffee0,
                       (JSFunctionDef *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (DynBuf *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (LabelSlot *)CONCAT44(in_stack_fffffffffffffec4,local_34),
                       CONCAT13(in_stack_fffffffffffffebf,
                                CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),iVar2
                       ,var_idx_00);
    return iVar2;
  }
  dbuf_putc((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
            in_stack_fffffffffffffebf);
  JS_DupAtom((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc);
  dbuf_put_u32((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               CONCAT13(in_stack_fffffffffffffebf,
                        CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
  dbuf_put_u16((DynBuf *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               CONCAT11(in_stack_fffffffffffffebf,in_stack_fffffffffffffebe));
  return in_stack_00000018;
}

Assistant:

static int resolve_scope_var(JSContext *ctx, JSFunctionDef *s,
                             JSAtom var_name, int scope_level, int op,
                             DynBuf *bc, uint8_t *bc_buf,
                             LabelSlot *ls, int pos_next)
{
    int idx, var_idx, is_put;
    int label_done;
    JSFunctionDef *fd;
    JSVarDef *vd;
    BOOL is_pseudo_var, is_arg_scope;

    label_done = -1;

    /* XXX: could be simpler to use a specific function to
       resolve the pseudo variables */
    is_pseudo_var = (var_name == JS_ATOM_home_object ||
                     var_name == JS_ATOM_this_active_func ||
                     var_name == JS_ATOM_new_target ||
                     var_name == JS_ATOM_this);

    /* resolve local scoped variables */
    var_idx = -1;
    for (idx = s->scopes[scope_level].first; idx >= 0;) {
        vd = &s->vars[idx];
        if (vd->var_name == var_name) {
            if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                if (vd->is_const) {
                    dbuf_putc(bc, OP_throw_error);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, JS_THROW_VAR_RO);
                    goto done;
                }
            }
            var_idx = idx;
            break;
        } else
        if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
            dbuf_putc(bc, OP_get_loc);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
        }
        idx = vd->scope_next;
    }
    is_arg_scope = (idx == ARG_SCOPE_END);
    if (var_idx < 0) {
        /* argument scope: variables are not visible but pseudo
           variables are visible */
        if (!is_arg_scope) {
            var_idx = find_var(ctx, s, var_name);
        }

        if (var_idx < 0 && is_pseudo_var)
            var_idx = resolve_pseudo_var(ctx, s, var_name);

        if (var_idx < 0 && var_name == JS_ATOM_arguments &&
            s->has_arguments_binding) {
            /* 'arguments' pseudo variable */
            var_idx = add_arguments_var(ctx, s);
        }
        if (var_idx < 0 && s->is_func_expr && var_name == s->func_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, s, var_name);
        }
    }
    if (var_idx >= 0) {
        if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
            !(var_idx & ARGUMENT_VAR_OFFSET) &&
            s->vars[var_idx].is_const) {
            /* only happens when assigning a function expression name
               in strict mode */
            dbuf_putc(bc, OP_throw_error);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            dbuf_putc(bc, JS_THROW_VAR_RO);
            goto done;
        }
        /* OP_scope_put_var_init is only used to initialize a
           lexical variable, so it is never used in a with or var object. It
           can be used with a closure (module global variable case). */
        switch (op) {
        case OP_scope_make_ref:
            if (!(var_idx & ARGUMENT_VAR_OFFSET) &&
                s->vars[var_idx].var_kind == JS_VAR_FUNCTION_NAME) {
                /* Create a dummy object reference for the func_var */
                dbuf_putc(bc, OP_object);
                dbuf_putc(bc, OP_get_loc);
                dbuf_put_u16(bc, var_idx);
                dbuf_putc(bc, OP_define_field);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, OP_push_atom_value);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            } else
            if (label_done == -1 && can_opt_put_ref_value(bc_buf, ls->pos)) {
                int get_op;
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    get_op = OP_get_arg;
                    var_idx -= ARGUMENT_VAR_OFFSET;
                } else {
                    if (s->vars[var_idx].is_lexical)
                        get_op = OP_get_loc_check;
                    else
                        get_op = OP_get_loc;
                }
                pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                   pos_next, get_op, var_idx);
            } else {
                /* Create a dummy object with a named slot that is
                   a reference to the local variable */
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    dbuf_putc(bc, OP_make_arg_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
                } else {
                    dbuf_putc(bc, OP_make_loc_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx);
                }
            }
            break;
        case OP_scope_get_ref:
            dbuf_putc(bc, OP_undefined);
            /* fall thru */
        case OP_scope_get_var_undef:
        case OP_scope_get_var:
        case OP_scope_put_var:
        case OP_scope_put_var_init:
            is_put = (op == OP_scope_put_var || op == OP_scope_put_var_init);
            if (var_idx & ARGUMENT_VAR_OFFSET) {
                dbuf_putc(bc, OP_get_arg + is_put);
                dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
            } else {
                if (is_put) {
                    if (s->vars[var_idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_loc_check_init);
                            else
                                dbuf_putc(bc, OP_put_loc);
                        } else {
                            dbuf_putc(bc, OP_put_loc_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_loc);
                    }
                } else {
                    if (s->vars[var_idx].is_lexical) {
                        dbuf_putc(bc, OP_get_loc_check);
                    } else {
                        dbuf_putc(bc, OP_get_loc);
                    }
                }
                dbuf_put_u16(bc, var_idx);
            }
            break;
        case OP_scope_delete_var:
            dbuf_putc(bc, OP_push_false);
            break;
        }
        goto done;
    }
    /* check eval object */
    if (!is_arg_scope && s->var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }
    /* check eval object in argument scope */
    if (s->arg_var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->arg_var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }

    /* check parent scopes */
    for (fd = s; fd->parent;) {
        scope_level = fd->parent_scope_level;
        fd = fd->parent;
        for (idx = fd->scopes[scope_level].first; idx >= 0;) {
            vd = &fd->vars[idx];
            if (vd->var_name == var_name) {
                if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                    if (vd->is_const) {
                        dbuf_putc(bc, OP_throw_error);
                        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                        dbuf_putc(bc, JS_THROW_VAR_RO);
                        goto done;
                    }
                }
                var_idx = idx;
                break;
            } else if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
                vd->is_captured = 1;
                idx = get_closure_var(ctx, s, fd, FALSE, idx, vd->var_name, FALSE, FALSE, JS_VAR_NORMAL);
                if (idx >= 0) {
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
                }
            }
            idx = vd->scope_next;
        }
        is_arg_scope = (idx == ARG_SCOPE_END);
        if (var_idx >= 0)
            break;
        
        if (!is_arg_scope) {
            var_idx = find_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (is_pseudo_var) {
            var_idx = resolve_pseudo_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (var_name == JS_ATOM_arguments && fd->has_arguments_binding) {
            var_idx = add_arguments_var(ctx, fd);
            break;
        }
        if (fd->is_func_expr && fd->func_name == var_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, fd, var_name);
            break;
        }

        /* check eval object */
        if (!is_arg_scope && fd->var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }

        /* check eval object in argument scope */
        if (fd->arg_var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->arg_var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->arg_var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }
        
        if (fd->is_eval)
            break; /* it it necessarily the top level function */
    }

    /* check direct eval scope (in the closure of the eval function
       which is necessarily at the top level) */
    if (!fd)
        fd = s;
    if (var_idx < 0 && fd->is_eval) {
        int idx1;
        for (idx1 = 0; idx1 < fd->closure_var_count; idx1++) {
            JSClosureVar *cv = &fd->closure_var[idx1];
            if (var_name == cv->var_name) {
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, cv->is_const,
                                           cv->is_lexical, cv->var_kind);
                } else {
                    idx = idx1;
                }
                goto has_idx;
            } else if ((cv->var_name == JS_ATOM__var_ ||
                        cv->var_name == JS_ATOM__arg_var_ ||
                        cv->var_name == JS_ATOM__with_) && !is_pseudo_var) {
                int is_with = (cv->var_name == JS_ATOM__with_);
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, FALSE, FALSE,
                                           JS_VAR_NORMAL);
                } else {
                    idx = idx1;
                }
                dbuf_putc(bc, OP_get_var_ref);
                dbuf_put_u16(bc, idx);
                var_object_test(ctx, s, var_name, op, bc, &label_done, is_with);
            }
        }
    }

    if (var_idx >= 0) {
        /* find the corresponding closure variable */
        if (var_idx & ARGUMENT_VAR_OFFSET) {
            fd->args[var_idx - ARGUMENT_VAR_OFFSET].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  TRUE, var_idx - ARGUMENT_VAR_OFFSET,
                                  var_name, FALSE, FALSE, JS_VAR_NORMAL);
        } else {
            fd->vars[var_idx].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  FALSE, var_idx,
                                  var_name,
                                  fd->vars[var_idx].is_const,
                                  fd->vars[var_idx].is_lexical,
                                  fd->vars[var_idx].var_kind);
        }
        if (idx >= 0) {
        has_idx:
            if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
                s->closure_var[idx].is_const) {
                dbuf_putc(bc, OP_throw_error);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, JS_THROW_VAR_RO);
                goto done;
            }
            switch (op) {
            case OP_scope_make_ref:
                if (s->closure_var[idx].var_kind == JS_VAR_FUNCTION_NAME) {
                    /* Create a dummy object reference for the func_var */
                    dbuf_putc(bc, OP_object);
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    dbuf_putc(bc, OP_define_field);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, OP_push_atom_value);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                } else
                if (label_done == -1 &&
                    can_opt_put_ref_value(bc_buf, ls->pos)) {
                    int get_op;
                    if (s->closure_var[idx].is_lexical)
                        get_op = OP_get_var_ref_check;
                    else
                        get_op = OP_get_var_ref;
                    pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                       pos_next,
                                                       get_op, idx);
                } else {
                    /* Create a dummy object with a named slot that is
                       a reference to the closure variable */
                    dbuf_putc(bc, OP_make_var_ref_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, idx);
                }
                break;
            case OP_scope_get_ref:
                /* XXX: should create a dummy object with a named slot that is
                   a reference to the closure variable */
                dbuf_putc(bc, OP_undefined);
                /* fall thru */
            case OP_scope_get_var_undef:
            case OP_scope_get_var:
            case OP_scope_put_var:
            case OP_scope_put_var_init:
                is_put = (op == OP_scope_put_var ||
                          op == OP_scope_put_var_init);
                if (is_put) {
                    if (s->closure_var[idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_var_ref_check_init);
                            else
                                dbuf_putc(bc, OP_put_var_ref);
                        } else {
                            dbuf_putc(bc, OP_put_var_ref_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_var_ref);
                    }
                } else {
                    if (s->closure_var[idx].is_lexical) {
                        dbuf_putc(bc, OP_get_var_ref_check);
                    } else {
                        dbuf_putc(bc, OP_get_var_ref);
                    }
                }
                dbuf_put_u16(bc, idx);
                break;
            case OP_scope_delete_var:
                dbuf_putc(bc, OP_push_false);
                break;
            }
            goto done;
        }
    }

    /* global variable access */

    switch (op) {
    case OP_scope_make_ref:
        if (label_done == -1 && can_opt_put_global_ref_value(bc_buf, ls->pos)) {
            pos_next = optimize_scope_make_global_ref(ctx, s, bc, bc_buf, ls,
                                                      pos_next, var_name);
        } else {
            dbuf_putc(bc, OP_make_var_ref);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        }
        break;
    case OP_scope_get_ref:
        /* XXX: should create a dummy object with a named slot that is
           a reference to the global variable */
        dbuf_putc(bc, OP_undefined);
        dbuf_putc(bc, OP_get_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_get_var_undef:
    case OP_scope_get_var:
    case OP_scope_put_var:
        dbuf_putc(bc, OP_get_var_undef + (op - OP_scope_get_var_undef));
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_put_var_init:
        dbuf_putc(bc, OP_put_var_init);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_delete_var:
        dbuf_putc(bc, OP_delete_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    }
done:
    if (label_done >= 0) {
        dbuf_putc(bc, OP_label);
        dbuf_put_u32(bc, label_done);
        s->label_slots[label_done].pos2 = bc->size;
    }
    return pos_next;
}